

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

bool __thiscall QPDFObjectHandle::isScalar(QPDFObjectHandle *this)

{
  bool bVar1;
  
  bVar1 = isBool(this);
  if (!bVar1) {
    bVar1 = isInteger(this);
    if (!bVar1) {
      bVar1 = isName(this);
      if (!bVar1) {
        bVar1 = isNull(this);
        if (!bVar1) {
          bVar1 = isReal(this);
          if (!bVar1) {
            bVar1 = isString(this);
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool
QPDFObjectHandle::isScalar() const
{
    return isBool() || isInteger() || isName() || isNull() || isReal() || isString();
}